

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

void __thiscall capnp::LocalPipeline::~LocalPipeline(LocalPipeline *this)

{
  Disposer *pDVar1;
  undefined8 *puVar2;
  
  pDVar1 = (this->context).disposer;
  if (pDVar1 != (Disposer *)0x0) {
    (this->context).disposer = (Disposer *)0x0;
    puVar2 = *(undefined8 **)&(this->super_Refcounted).refcount;
    (**(code **)*puVar2)(puVar2,pDVar1->_vptr_Disposer[-2] + (long)&pDVar1->_vptr_Disposer);
  }
  kj::Refcounted::~Refcounted((Refcounted *)this);
  operator_delete(&this[-1].results.reader.nestingLimit,0x48);
  return;
}

Assistant:

inline LocalPipeline(kj::Own<CallContextHook>&& contextParam)
      : context(kj::mv(contextParam)),
        results(context->getResults(MessageSize { 0, 0 })) {}